

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_twospirals.cpp
# Opt level: O2

int main(void)

{
  char cVar1;
  MakeNet *pMVar2;
  ostream *poVar3;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  allocator local_399;
  PlainTextNetworkWriter local_398;
  SquareAugmented SQUARE;
  string dumpfile;
  allocator_type local_368 [32];
  IntClassifier classifier;
  Net net;
  _Vector_base<int,_std::allocator<int>_> local_308;
  _Vector_base<int,_std::allocator<int>_> local_2f0;
  code *local_2d8 [2];
  code *local_2c8;
  code *local_2c0;
  LabeledDataset testset;
  LabeledDataset trainset;
  ofstream nnfile;
  undefined4 uStack_224;
  _Any_data local_220;
  pointer pMStack_210;
  pointer pMStack_208;
  
  testset.nSamples._0_1_ = 0x2c;
  std::__cxx11::string::string
            ((string *)&nnfile,"../datatwospirals-train.csv",(allocator *)&dumpfile);
  net._vptr_Net._0_4_ = 0xffffffff;
  __l._M_len = 1;
  __l._M_array = (iterator)&net;
  notch::core::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_2f0,__l,local_368);
  notch::io::CSVReader::read((CSVReader *)&trainset,(int)&testset,&nnfile,(size_t)&local_2f0);
  notch::core::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_2f0);
  std::__cxx11::string::~string((string *)&nnfile);
  net._vptr_Net._0_1_ = 0x2c;
  std::__cxx11::string::string
            ((string *)&nnfile,"../datatwospirals-test.csv",(allocator *)local_368);
  dumpfile._M_dataplus._M_p._0_4_ = 0xffffffff;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&dumpfile;
  notch::core::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_308,__l_00,(allocator_type *)&classifier);
  notch::io::CSVReader::read((CSVReader *)&testset,(int)&net,&nnfile,(size_t)&local_308);
  notch::core::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_308);
  std::__cxx11::string::~string((string *)&nnfile);
  SQUARE.super_ADatasetTransformer._vptr_ADatasetTransformer =
       (ADatasetTransformer)&PTR_apply_00133550;
  notch::core::LabeledDataset::apply(&trainset,&SQUARE.super_ADatasetTransformer);
  notch::core::LabeledDataset::apply(&testset,&SQUARE.super_ADatasetTransformer);
  notch::core::MakeNet::MakeNet((MakeNet *)&nnfile,trainset.inputDimension);
  pMVar2 = notch::core::MakeNet::addFC
                     ((MakeNet *)&nnfile,0x50,(Activation *)notch::core::scaledTanh);
  pMVar2 = notch::core::MakeNet::addFC(pMVar2,0x14,(Activation *)notch::core::scaledTanh);
  pMVar2 = notch::core::MakeNet::addFC(pMVar2,1,(Activation *)notch::core::scaledTanh);
  pMVar2 = notch::core::MakeNet::addL2Loss(pMVar2);
  local_2d8[1] = (code *)0x0;
  local_2d8[0] = notch::core::Init::normalXavier;
  local_2c0 = notch::core::std::
              _Function_handler<void_(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int),_void_(*)(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int)>
              ::_M_invoke;
  local_2c8 = notch::core::std::
              _Function_handler<void_(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int),_void_(*)(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int)>
              ::_M_manager;
  notch::core::MakeNet::init((MakeNet *)&net,(EVP_PKEY_CTX *)pMVar2);
  notch::core::std::_Function_base::~_Function_base((_Function_base *)local_2d8);
  notch::core::MakeNet::~MakeNet((MakeNet *)&nnfile);
  _nnfile = &PTR_update_00133c18;
  local_220._M_unused._M_object = (void *)0x358637bd3f733333;
  local_220._8_8_ = (pointer)0x0;
  pMStack_210 = (pointer)0x0;
  notch::core::Net::setLearningPolicy(&net,(ALearningPolicy *)&nnfile);
  classifier.super_AClassifier<int,_0>._vptr_AClassifier = (_func_int **)&PTR_aslabel_00133c60;
  _nnfile = (undefined **)CONCAT44(uStack_224,10000);
  local_220._M_unused._M_object = (void *)0x0;
  local_220._8_8_ = (pointer)0x0;
  pMStack_210 = (pointer)0x0;
  pMStack_208 = (pointer)0x0;
  classifier.net = &net;
  local_220._M_unused._M_object = operator_new(0x20);
  *(IntClassifier **)local_220._M_unused._0_8_ = &classifier;
  *(LabeledDataset **)((long)local_220._M_unused._0_8_ + 8) = &testset;
  *(Net **)((long)local_220._M_unused._0_8_ + 0x10) = &net;
  *(LabeledDataset **)((long)local_220._M_unused._0_8_ + 0x18) = &trainset;
  pMStack_208 = (pointer)notch::core::std::
                         _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/examples/demo_twospirals.cpp:66:39)>
                         ::_M_invoke;
  pMStack_210 = (pointer)notch::core::std::
                         _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/examples/demo_twospirals.cpp:66:39)>
                         ::_M_manager;
  notch::core::SGD::train
            (&net,&trainset,130000,(EpochCallback *)&nnfile,
             (IterationCallback *)notch::core::noIterationCallback);
  notch::core::std::_Function_base::~_Function_base((_Function_base *)&local_220);
  std::__cxx11::string::string
            ((string *)&dumpfile,"demo_twospirals_network.txt",(allocator *)&nnfile);
  std::ofstream::ofstream(&nnfile,(string *)&dumpfile,_S_out);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    local_398.out = (ostream *)&nnfile;
    notch::io::PlainTextNetworkWriter::save(&local_398,&net);
    std::__cxx11::string::string((string *)local_368,"\n",&local_399);
    std::operator<<(local_398.out,(string *)local_368);
    std::__cxx11::string::~string((string *)local_368);
    poVar3 = std::operator<<((ostream *)&std::cout,"wrote ");
    poVar3 = std::operator<<(poVar3,(string *)&dumpfile);
    std::operator<<(poVar3,"\n");
  }
  std::ofstream::~ofstream(&nnfile);
  std::__cxx11::string::~string((string *)&dumpfile);
  notch::core::Net::~Net(&net);
  notch::core::LabeledDataset::~LabeledDataset(&testset);
  notch::core::LabeledDataset::~LabeledDataset(&trainset);
  return 0;
}

Assistant:

int main() {
    auto trainset = CSVReader().read(PATH_TO_DATA "twospirals-train.csv");
    auto testset = CSVReader().read(PATH_TO_DATA "twospirals-test.csv");

    // with SQUARE: accuracy = 99.5% (130000 epochs on 4-80-20-1 NN, ~5 min)
    // without:     accuracy = 99.5% (50000 epochs on 2-50-50-50-50-10-1 NN, ~7 min)
    SquareAugmented SQUARE;
    trainset.apply(SQUARE);
    testset.apply(SQUARE);

    Net net = MakeNet(trainset.inputDim())
        .addFC(80, scaledTanh)
        .addFC(20, scaledTanh)
        .addFC(1, scaledTanh)
        .addL2Loss()
        .init();

    net.setLearningPolicy(AdaDelta());

    auto classifier = IntClassifier(net);

    SGD::train(net, trainset,
               130000 /* epochs */,
               EpochCallback { 10000, [&](int i) {
                   auto cm = classifier.test(testset); // confusion matrix
                   cout << "epoch "
                        << setw(6) << i << " "
                        << " train loss = "
                        << setprecision(3) << setw(5) << showpoint
                        << meanLoss(net, trainset)
                        << " test loss = "
                        << setprecision(3) << setw(5) << showpoint
                        << meanLoss(net, testset)
                        << " accuracy = "
                        << setprecision(3) << setw(5) << showpoint
                        << cm.accuracy()
                        << " F1 = "
                        << setprecision(3) << setw(5) << showpoint
                        << cm.F1score()
                        << endl;
                   return false;
               }});

    string dumpfile = "demo_twospirals_network.txt";
    ofstream nnfile(dumpfile);
    if (nnfile.is_open()) {
        PlainTextNetworkWriter(nnfile) << net << "\n";
        cout << "wrote " << dumpfile << "\n";
    }
}